

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsearch.h
# Opt level: O2

void __thiscall
SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
::SearchTask(SearchTask<std::vector<wt,_std::allocator<wt>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             *this,vw *vw_obj)

{
  undefined8 *puVar1;
  example *peVar2;
  
  this->_vptr_SearchTask = (_func_int **)&PTR__SearchTask_002a3d80;
  this->vw_obj = vw_obj;
  this->sch = (search *)vw_obj->searchstr;
  peVar2 = VW::alloc_examples((vw_obj->p->lp).label_size,1);
  this->bogus_example = peVar2;
  VW::read_line(vw_obj,peVar2,"1 | x");
  VW::setup_example(vw_obj,this->bogus_example);
  peVar2 = VW::alloc_examples((vw_obj->p->lp).label_size,1);
  this->blank_line = peVar2;
  VW::read_line(vw_obj,peVar2,"");
  VW::setup_example(vw_obj,this->blank_line);
  puVar1 = (undefined8 *)this->sch->task_data;
  *puVar1 = _search_run_fn;
  puVar1[1] = _search_setup_fn;
  puVar1[2] = _search_takedown_fn;
  puVar1[3] = this;
  puVar1[9] = 0;
  puVar1[10] = 0;
  return;
}

Assistant:

SearchTask(vw& vw_obj) : vw_obj(vw_obj), sch(*(Search::search*)vw_obj.searchstr)
  { bogus_example = VW::alloc_examples(vw_obj.p->lp.label_size, 1);
    VW::read_line(vw_obj, bogus_example, (char*)"1 | x");
    VW::setup_example(vw_obj, bogus_example);

    blank_line = VW::alloc_examples(vw_obj.p->lp.label_size, 1);
    VW::read_line(vw_obj, blank_line, (char*)"");
    VW::setup_example(vw_obj, blank_line);

    HookTask::task_data* d = sch.get_task_data<HookTask::task_data>();
    d->run_f = _search_run_fn;
    d->run_setup_f = _search_setup_fn;
    d->run_takedown_f = _search_takedown_fn;
    d->run_object = this;
    d->extra_data  = NULL;
    d->extra_data2 = NULL;
  }